

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O3

uint rlLoadTextureCubemap(void *data,int size,int format)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  char *text;
  ulong uVar4;
  long lVar5;
  uint id;
  uint local_64;
  uint glType;
  uint glFormat;
  ulong local_58;
  ulong local_50;
  GLint swizzleMask [4];
  uint glInternalFormat;
  
  id = 0;
  iVar2 = rlGetPixelDataSize(size,size,format);
  (*glad_glGenTextures)(1,&id);
  (*glad_glBindTexture)(0x8513,id);
  rlGetGlTextureFormats(format,&glInternalFormat,&glFormat,&glType);
  if (glInternalFormat != 0xffffffff) {
    local_50 = (ulong)glFormat;
    local_58 = (ulong)glType;
    local_64 = format & 0xfffffffd;
    lVar5 = -6;
    uVar4 = 0;
    do {
      iVar1 = (int)lVar5;
      if (data == (void *)0x0) {
        if (10 < format) {
          text = "TEXTURES: Empty cubemap creation does not support compressed format";
LAB_00119467:
          TraceLog(4,text);
          goto LAB_0011946e;
        }
        if (format != 9) {
          if (local_64 != 8) {
            pvVar3 = (void *)0x0;
            goto LAB_001193dd;
          }
          text = "TEXTURES: Cubemap requested format not supported";
          goto LAB_00119467;
        }
        if (RLGL.ExtSupported.texFloat32 == true) {
          (*glad_glTexImage2D)(iVar1 + 0x851b,0,0x1907,size,size,0,0x1907,0x1406,(void *)0x0);
        }
        else {
          TraceLog(4,"TEXTURES: Cubemap requested format not supported");
        }
      }
      else {
        pvVar3 = (void *)(uVar4 + (long)data);
        if (format < 0xb) {
LAB_001193dd:
          (*glad_glTexImage2D)
                    (iVar1 + 0x851b,0,glInternalFormat,size,size,0,(GLenum)local_50,(GLenum)local_58
                     ,pvVar3);
        }
        else {
          (*glad_glCompressedTexImage2D)(iVar1 + 0x851b,0,glInternalFormat,size,size,0,iVar2,pvVar3)
          ;
        }
LAB_0011946e:
        if (format == 2) {
          swizzleMask[3] = 0x1904;
        }
        else {
          if (format != 1) goto LAB_001194a2;
          swizzleMask[3] = 1;
        }
        swizzleMask[0] = 0x1903;
        swizzleMask[1] = 0x1903;
        swizzleMask[2] = 0x1903;
        (*glad_glTexParameteriv)(0x8513,0x8e46,swizzleMask);
      }
LAB_001194a2:
      uVar4 = (ulong)(uint)((int)uVar4 + iVar2);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0);
  }
  (*glad_glTexParameteri)(0x8513,0x2801,0x2601);
  (*glad_glTexParameteri)(0x8513,0x2800,0x2601);
  (*glad_glTexParameteri)(0x8513,0x2802,0x812f);
  (*glad_glTexParameteri)(0x8513,0x2803,0x812f);
  (*glad_glTexParameteri)(0x8513,0x8072,0x812f);
  (*glad_glBindTexture)(0x8513,0);
  if (id == 0) {
    TraceLog(4,"TEXTURE: Failed to load cubemap texture");
  }
  else {
    TraceLog(3,"TEXTURE: [ID %i] Cubemap texture loaded successfully (%ix%i)",(ulong)id,size,size);
  }
  return id;
}

Assistant:

unsigned int rlLoadTextureCubemap(void *data, int size, int format)
{
    unsigned int id = 0;

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    unsigned int dataSize = rlGetPixelDataSize(size, size, format);

    glGenTextures(1, &id);
    glBindTexture(GL_TEXTURE_CUBE_MAP, id);

    unsigned int glInternalFormat, glFormat, glType;
    rlGetGlTextureFormats(format, &glInternalFormat, &glFormat, &glType);

    if (glInternalFormat != -1)
    {
        // Load cubemap faces
        for (unsigned int i = 0; i < 6; i++)
        {
            if (data == NULL)
            {
                if (format < PIXELFORMAT_COMPRESSED_DXT1_RGB)
                {
                    if (format == PIXELFORMAT_UNCOMPRESSED_R32G32B32)
                    {
                        // Instead of using a sized internal texture format (GL_RGB16F, GL_RGB32F), we let the driver to choose the better format for us (GL_RGB)
                        if (RLGL.ExtSupported.texFloat32) glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, GL_RGB, size, size, 0, GL_RGB, GL_FLOAT, NULL);
                        else TRACELOG(LOG_WARNING, "TEXTURES: Cubemap requested format not supported");
                    }
                    else if ((format == PIXELFORMAT_UNCOMPRESSED_R32) || (format == PIXELFORMAT_UNCOMPRESSED_R32G32B32A32)) TRACELOG(LOG_WARNING, "TEXTURES: Cubemap requested format not supported");
                    else glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, glInternalFormat, size, size, 0, glFormat, glType, NULL);
                }
                else TRACELOG(LOG_WARNING, "TEXTURES: Empty cubemap creation does not support compressed format");
            }
            else
            {
                if (format < PIXELFORMAT_COMPRESSED_DXT1_RGB) glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, glInternalFormat, size, size, 0, glFormat, glType, (unsigned char *)data + i*dataSize);
                else glCompressedTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, glInternalFormat, size, size, 0, dataSize, (unsigned char *)data + i*dataSize);
            }

#if defined(GRAPHICS_API_OPENGL_33)
            if (format == PIXELFORMAT_UNCOMPRESSED_GRAYSCALE)
            {
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_ONE };
                glTexParameteriv(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
            }
            else if (format == PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA)
            {
#if defined(GRAPHICS_API_OPENGL_21)
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_ALPHA };
#elif defined(GRAPHICS_API_OPENGL_33)
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_GREEN };
#endif
                glTexParameteriv(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
            }
#endif
        }
    }

    // Set cubemap texture sampling parameters
    glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
#if defined(GRAPHICS_API_OPENGL_33)
    glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);  // Flag not supported on OpenGL ES 2.0
#endif

    glBindTexture(GL_TEXTURE_CUBE_MAP, 0);
#endif

    if (id > 0) TRACELOG(LOG_INFO, "TEXTURE: [ID %i] Cubemap texture loaded successfully (%ix%i)", id, size, size);
    else TRACELOG(LOG_WARNING, "TEXTURE: Failed to load cubemap texture");

    return id;
}